

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O3

int __thiscall glcts::SeparateShaderObjsTests::init(SeparateShaderObjsTests *this,EVP_PKEY_CTX *ctx)

{
  GLSLVersion GVar1;
  Context *pCVar2;
  int extraout_EAX;
  TestNode *pTVar3;
  
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"CreateShadProgApi","createShaderProgram API");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020f2f78;
  *(GLSLVersion *)&pTVar3[1].m_testCtx = GVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"UseProgStagesApi","useProgramStages API");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020f2fc8;
  *(GLSLVersion *)&pTVar3[1].m_testCtx = GVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase((TestCase *)pTVar3,pCVar2->m_testCtx,"PipelineApi","Pipeline API");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020f3018;
  *(GLSLVersion *)&pTVar3[1].m_testCtx = GVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"ProgUniformAPI","ProgramUniform API");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020f3068;
  *(GLSLVersion *)&pTVar3[1].m_testCtx = GVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"StateInteraction","SSO State Interactions");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020f30b8;
  *(GLSLVersion *)&pTVar3[1].m_testCtx = GVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"InterfacePrecisionMatchingFloat",
             "matching precision qualifiers between stages");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(GLSLVersion *)&pTVar3[1].m_testCtx = GVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020f3108;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"InterfacePrecisionMatchingInt",
             "matching precision qualifiers between stages");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(GLSLVersion *)&pTVar3[1].m_testCtx = GVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020f3180;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar3 = (TestNode *)operator_new(0x80);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar3,pCVar2->m_testCtx,"InterfacePrecisionMatchingUInt",
             "matching precision qualifiers between stages");
  pTVar3[1]._vptr_TestNode = (_func_int **)pCVar2;
  *(GLSLVersion *)&pTVar3[1].m_testCtx = GVar1;
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_020f31e0;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  return extraout_EAX;
}

Assistant:

void SeparateShaderObjsTests::init(void)
{

	// API validation for CreateShaderProgram
	addChild(new CreateShadProgCase(m_context, "CreateShadProgApi", "createShaderProgram API", m_glslVersion));
	// API validation for UseProgramStages
	addChild(new UseProgStagesCase(m_context, "UseProgStagesApi", "useProgramStages API", m_glslVersion));
	// API validation for pipeline related functions
	addChild(new PipelineApiCase(m_context, "PipelineApi", "Pipeline API", m_glslVersion));
	// API validation for variations of ProgramUniform
	addChild(new ProgramUniformCase(m_context, "ProgUniformAPI", "ProgramUniform API", m_glslVersion));
	// State interactions
	addChild(new StateInteractionCase(m_context, "StateInteraction", "SSO State Interactions", m_glslVersion));
	// input / output precision matching
	addChild(new InterfaceMatchingCaseFloat(m_context, "InterfacePrecisionMatchingFloat", m_glslVersion));
	addChild(new InterfaceMatchingCaseInt(m_context, "InterfacePrecisionMatchingInt", m_glslVersion));
	addChild(new InterfaceMatchingCaseUInt(m_context, "InterfacePrecisionMatchingUInt", m_glslVersion));
}